

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-context.c
# Opt level: O3

void textui_process_click(ui_event e)

{
  loc grid;
  loc start;
  ushort uVar1;
  chunk_conflict *pcVar2;
  player *ppVar3;
  _Bool _Var4;
  loc lVar5;
  loc_conflict grid2;
  object *poVar6;
  monster *m;
  command_conflict *pcVar7;
  wchar_t adjacent;
  wchar_t wVar8;
  wchar_t my;
  cmd_code cVar9;
  keycode_t k;
  wchar_t x;
  ulong uVar10;
  char cVar11;
  wchar_t mx;
  
  pcVar2 = cave;
  if ((player->opts).opt[0x13] != true) {
    return;
  }
  my = e.key.code >> 8 & 0xff;
  wVar8 = (my - row_top_map[Term->sidebar_mode]) / (int)(uint)tile_height + Term->offset_y;
  mx = e.key.code & 0xff;
  x = (mx - col_map[Term->sidebar_mode]) / (int)(uint)tile_width + Term->offset_x;
  lVar5 = (loc)loc(x,wVar8);
  _Var4 = square_in_bounds_fully(pcVar2,lVar5);
  ppVar3 = player;
  if (!_Var4) {
    return;
  }
  uVar10 = e._0_8_ >> 0x38;
  grid2 = loc(x,wVar8);
  _Var4 = loc_eq(ppVar3->grid,grid2);
  pcVar2 = cave;
  cVar11 = e.key.code._2_1_;
  uVar1 = e.key.code._2_2_;
  if (_Var4) {
    if ((uVar10 & 2) == 0) {
      if ((uVar10 & 1) == 0) {
        if ((uVar10 & 4) != 0) {
          if ((e._0_8_ & 0xff000000000000) != 0x1000000000000) {
            return;
          }
          k = 0x43;
          goto LAB_001bf331;
        }
        if (cVar11 == '\x02') {
          context_menu_player(mx,my);
          return;
        }
        if ((uVar1 & 0xff) != 1) {
          return;
        }
        lVar5 = (loc)loc(x,wVar8);
        poVar6 = square_object(pcVar2,lVar5);
        if (poVar6 == (object *)0x0) {
          cVar9 = CMD_HOLD;
        }
        else {
          cVar9 = CMD_PICKUP;
        }
      }
      else if (cVar11 == '\x02') {
        cVar9 = CMD_USE;
      }
      else {
        if ((uVar1 & 0xff) != 1) {
          return;
        }
        lVar5.x = (player->grid).x;
        lVar5.y = (player->grid).y;
        _Var4 = square_isupstairs(cave,lVar5);
        if (_Var4) {
          cVar9 = CMD_GO_UP;
        }
        else {
          grid.x = (player->grid).x;
          grid.y = (player->grid).y;
          _Var4 = square_isdownstairs(cave,grid);
          if (!_Var4) {
            return;
          }
          cVar9 = CMD_GO_DOWN;
        }
      }
    }
    else {
      if (cVar11 == '\x02') {
        k = 0x69;
LAB_001bf331:
        Term_keypress(k,'\0');
        return;
      }
      if ((uVar1 & 0xff) != 1) {
        return;
      }
      cVar9 = CMD_CAST;
    }
  }
  else {
    if (cVar11 == '\x02') {
      lVar5 = (loc)loc(x,wVar8);
      m = square_monster(pcVar2,lVar5);
      if ((m == (monster *)0x0) || (_Var4 = target_able(m), !_Var4)) {
        target_set_location(wVar8,x);
      }
      else {
        monster_race_track(player->upkeep,m->race);
        health_track(player->upkeep,m);
        target_set_monster(m);
      }
      if ((uVar10 & 2) == 0) {
        if ((uVar10 & 1) == 0) {
          if ((uVar10 & 4) == 0) {
            if (((uint)((wVar8 - (player->grid).y) + 1U) < 3) &&
               ((uint)((x - (player->grid).x) + 1U) < 3)) {
              adjacent = L'\x01';
            }
            else {
              adjacent = L'\0';
            }
            context_menu_cave((chunk_conflict2 *)cave,wVar8,x,adjacent,mx,my);
            return;
          }
          cVar9 = CMD_THROW;
        }
        else {
          cVar9 = CMD_USE;
        }
      }
      else {
        cVar9 = CMD_CAST;
      }
      cmdq_push(cVar9);
      pcVar7 = cmdq_peek();
      cmd_set_arg_target(pcVar7,"target",L'\x05');
      return;
    }
    if ((uVar1 & 0xff) != 1) {
      return;
    }
    if (player->timed[4] == 0) {
      if ((uVar10 & 2) == 0) {
        if ((uVar10 & 1) == 0) {
          if ((uVar10 & 4) != 0) {
            _Var4 = target_set_interactive(L'\x02',x,wVar8);
            if (!_Var4) {
              return;
            }
            msg("Target Selected.");
            return;
          }
          if ((2 < (uint)((wVar8 - (player->grid).y) + 1U)) ||
             (2 < (uint)((x - (player->grid).x) + 1U))) {
            cmdq_push(CMD_PATHFIND);
            pcVar7 = cmdq_peek();
            lVar5 = (loc)loc(x,wVar8);
            cmd_set_arg_point(pcVar7,"point",lVar5);
            return;
          }
          cVar9 = CMD_WALK;
        }
        else {
          cVar9 = CMD_ALTER;
        }
      }
      else {
        cVar9 = CMD_RUN;
      }
      cmdq_push(cVar9);
      pcVar7 = cmdq_peek();
      ppVar3 = player;
      lVar5 = (loc)loc(x,wVar8);
      start.x = (ppVar3->grid).x;
      start.y = (ppVar3->grid).y;
      wVar8 = motion_dir(start,lVar5);
      cmd_set_arg_direction(pcVar7,"direction",wVar8);
      return;
    }
    cVar9 = CMD_WALK;
  }
  cmdq_push(cVar9);
  return;
}

Assistant:

void textui_process_click(ui_event e)
{
	int x, y;

	if (!OPT(player, mouse_movement)) return;

	y = KEY_GRID_Y(e);
	x = KEY_GRID_X(e);

	/* Check for a valid location */
	if (!square_in_bounds_fully(cave, loc(x, y))) return;

	/* XXX show context menu here */
	if (loc_eq(player->grid, loc(x, y))) {
		if (e.mouse.mods & KC_MOD_SHIFT) {
			/* shift-click - cast magic */
			if (e.mouse.button == 1) {
				cmdq_push(CMD_CAST);
			} else if (e.mouse.button == 2) {
				Term_keypress('i',0);
			}
		} else if (e.mouse.mods & KC_MOD_CONTROL) {
			/* ctrl-click - use feature / use inventory item */
			/* switch with default */
			if (e.mouse.button == 1) {
				if (square_isupstairs(cave, player->grid))
					cmdq_push(CMD_GO_UP);
				else if (square_isdownstairs(cave, player->grid))
					cmdq_push(CMD_GO_DOWN);
			} else if (e.mouse.button == 2) {
				cmdq_push(CMD_USE);
			}
		} else if (e.mouse.mods & KC_MOD_ALT) {
			/* alt-click - show char screen */
			/* XXX call a platform specific hook */
			if (e.mouse.button == 1) {
				Term_keypress('C',0);
			}
		} else {
			if (e.mouse.button == 1) {
				if (square_object(cave, loc(x, y))) {
					cmdq_push(CMD_PICKUP);
				} else {
					cmdq_push(CMD_HOLD);
				}
			} else if (e.mouse.button == 2) {
				/* Show a context menu */
				context_menu_player(e.mouse.x, e.mouse.y);
			}
		}
	} else if (e.mouse.button == 1) {
		if (player->timed[TMD_CONFUSED]) {
			cmdq_push(CMD_WALK);
		} else {
			if (e.mouse.mods & KC_MOD_SHIFT) {
				/* shift-click - run */
				cmdq_push(CMD_RUN);
				cmd_set_arg_direction(cmdq_peek(), "direction",
									  motion_dir(player->grid, loc(x, y)));
			} else if (e.mouse.mods & KC_MOD_CONTROL) {
				/* control-click - alter */
				cmdq_push(CMD_ALTER);
				cmd_set_arg_direction(cmdq_peek(), "direction",
									  motion_dir(player->grid, loc(x, y)));
			} else if (e.mouse.mods & KC_MOD_ALT) {
				/* alt-click - look */
				if (target_set_interactive(TARGET_LOOK, x, y)) {
					msg("Target Selected.");
				}
			} else {
				/* Pathfind does not work well on trap detection borders,
				 * so if the click is next to the player, force a walk step */
				if ((y - player->grid.y >= -1) && (y - player->grid.y <= 1)	&&
					(x - player->grid.x >= -1) && (x - player->grid.x <= 1)) {
					cmdq_push(CMD_WALK);
					cmd_set_arg_direction(cmdq_peek(), "direction",
										  motion_dir(player->grid, loc(x, y)));
				} else {
					cmdq_push(CMD_PATHFIND);
					cmd_set_arg_point(cmdq_peek(), "point", loc(x, y));
				}
			}
		}
	} else if (e.mouse.button == 2) {
		struct monster *m = square_monster(cave, loc(x, y));
		if (m && target_able(m)) {
			/* Set up target information */
			monster_race_track(player->upkeep, m->race);
			health_track(player->upkeep, m);
			target_set_monster(m);
		} else {
			target_set_location(y, x);
		}

		if (e.mouse.mods & KC_MOD_SHIFT) {
			/* shift-click - cast spell at target */
			cmdq_push(CMD_CAST);
			cmd_set_arg_target(cmdq_peek(), "target", DIR_TARGET);
		} else if (e.mouse.mods & KC_MOD_CONTROL) {
			/* control-click - fire at target */
			cmdq_push(CMD_USE);
			cmd_set_arg_target(cmdq_peek(), "target", DIR_TARGET);
		} else if (e.mouse.mods & KC_MOD_ALT) {
			/* alt-click - throw at target */
			cmdq_push(CMD_THROW);
			cmd_set_arg_target(cmdq_peek(), "target", DIR_TARGET);
		} else {
			/* see if the click was adjacent to the player */
			if ((y - player->grid.y >= -1) && (y - player->grid.y <= 1)	&&
				(x - player->grid.x >= -1) && (x - player->grid.x <= 1)) {
				context_menu_cave(cave,y,x,1,e.mouse.x, e.mouse.y);
			} else {
				context_menu_cave(cave,y,x,0,e.mouse.x, e.mouse.y);
			}
		}
	}
}